

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
NLReaderTest_WriteBinaryHeader_Test::TestBody(NLReaderTest_WriteBinaryHeader_Test *this)

{
  long lVar1;
  long *plVar2;
  char *message;
  AssertHelper AStack_378;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  NLHeader header;
  MemoryWriter w;
  
  memset(&header,0,0x110);
  mp::NLHeader::NLHeader(&header);
  header.super_NLInfo.super_NLInfo_C.format = 1;
  header.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  plVar2 = header.super_NLInfo.super_NLInfo_C.ampl_options;
  for (lVar1 = 0xb; lVar1 != 0x2c; lVar1 = lVar1 + 0xb) {
    *plVar2 = lVar1;
    plVar2 = plVar2 + 1;
  }
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002b01a0;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  header.super_NLInfo.super_NLInfo_C.arith_kind = 5;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002b01e8;
  mp::operator<<(&w.super_BasicWriter<char>,&header);
  fmt::BasicWriter<char>::str_abi_cxx11_(&local_360,&w.super_BasicWriter<char>);
  testing::internal::CmpHelperEQ<char[92],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"b3 11 22 33\\n\" \" 0 0 0 0 0 0\\n\" \" 0 0 0 0 0 0\\n\" \" 0 0\\n\" \" 0 0 0\\n\" \" 0 0 5 0\\n\" \" 0 0 0 0 0\\n\" \" 0 0\\n\" \" 0 0\\n\" \" 0 0 0 0 0\\n\""
             ,"w.str()",
             (char (*) [92])
             "b3 11 22 33\n 0 0 0 0 0 0\n 0 0 0 0 0 0\n 0 0\n 0 0 0\n 0 0 5 0\n 0 0 0 0 0\n 0 0\n 0 0\n 0 0 0 0 0\n"
             ,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_360);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x355,message);
    testing::internal::AssertHelper::operator=(&AStack_378,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&AStack_378);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_360);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w);
  return;
}

Assistant:

TEST(NLReaderTest, WriteBinaryHeader) {
  NLHeader header = NLHeader();
  header.format = NLHeader::BINARY;
  header.num_ampl_options = 3;
  for (int i = 0; i < header.num_ampl_options; ++i)
    header.ampl_options[i] = 11 * (i + 1);
  header.arith_kind = (NLArithKind)mp::arith::CRAY;
  fmt::MemoryWriter w;
  w << header;
  EXPECT_EQ(
      "b3 11 22 33\n"
      " 0 0 0 0 0 0\n"
      " 0 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0 0\n"
      " 0 0 5 0\n"
      " 0 0 0 0 0\n"
      " 0 0\n"
      " 0 0\n"
      " 0 0 0 0 0\n",
      w.str());
}